

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O0

uint8_t * __thiscall
Lodtalk::MethodAssembler::ConditionalJump::encode(ConditionalJump *this,uint8_t *buffer)

{
  uint8_t uVar1;
  ptrdiff_t pVar2;
  uint8_t *puVar3;
  ptrdiff_t delta;
  uint8_t *buffer_local;
  ConditionalJump *this_local;
  
  pVar2 = jumpDeltaValue(this);
  this_local = (ConditionalJump *)buffer;
  if (pVar2 != 0) {
    if ((pVar2 < 1) || (8 < pVar2)) {
      puVar3 = InstructionNode::encodeExtB(&this->super_InstructionNode,buffer,pVar2 / 0x100);
      uVar1 = 0xef;
      if ((this->condition & 1U) != 0) {
        uVar1 = 0xee;
      }
      *puVar3 = uVar1;
      this_local = (ConditionalJump *)(puVar3 + 2);
      puVar3[1] = (uint8_t)(pVar2 % 0x100);
    }
    else {
      if ((this->condition & 1U) == 0) {
        *buffer = (char)pVar2 + 0xbf;
      }
      else {
        *buffer = (char)pVar2 + 0xb7;
      }
      delta = (long)buffer + 1;
      this_local = (ConditionalJump *)delta;
    }
  }
  return (uint8_t *)this_local;
}

Assistant:

virtual uint8_t *encode(uint8_t *buffer)
	{
        auto delta = jumpDeltaValue();
        if(delta == 0)
            return buffer;

        if(1 <= delta && delta <= 8)
        {
            if(condition)
                *buffer++ = uint8_t(BytecodeSet::JumpOnTrueShortFirst + delta - 1);
            else
                *buffer++ = uint8_t(BytecodeSet::JumpOnFalseShortFirst + delta - 1);
            return buffer;
        }

        buffer = encodeExtB(buffer, delta / 256);
        *buffer++ = condition ? BytecodeSet::JumpOnTrue : BytecodeSet::JumpOnFalse;
        *buffer++ = delta % 256;
		return buffer;
	}